

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters ZVar1;
  size_t sVar2;
  ZSTD_CCtx_params *in_RDI;
  undefined4 uStack0000000000000008;
  undefined4 uStack000000000000000c;
  undefined8 in_stack_ffffffffffffffb4;
  ZSTD_CCtx_params *cctxParams;
  
  ZVar1 = cParams;
  memset(in_RDI,0,0x90);
  (in_RDI->cParams).windowLog = uStack0000000000000008;
  (in_RDI->cParams).chainLog = uStack000000000000000c;
  (in_RDI->cParams).hashLog = cParams.windowLog;
  (in_RDI->cParams).searchLog = cParams.chainLog;
  cParams._8_8_ = ZVar1._8_8_;
  (in_RDI->cParams).minMatch = cParams.hashLog;
  (in_RDI->cParams).targetLength = cParams.searchLog;
  cParams.minMatch = ZVar1.minMatch;
  (in_RDI->cParams).strategy = cParams.minMatch;
  in_RDI->compressionLevel = 3;
  cParams._0_20_ = ZVar1._0_20_;
  ZVar1.targetLength = (int)in_stack_ffffffffffffffb4;
  ZVar1.strategy = (int)((ulong)in_stack_ffffffffffffffb4 >> 0x20);
  ZVar1.windowLog = cParams.windowLog;
  ZVar1.chainLog = cParams.chainLog;
  ZVar1.hashLog = cParams.hashLog;
  ZVar1.searchLog = cParams.searchLog;
  ZVar1.minMatch = cParams.minMatch;
  sVar2 = ZSTD_checkCParams(ZVar1);
  if (sVar2 != 0) {
    __assert_fail("!ZSTD_checkCParams(cParams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2b0f,
                  "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
  }
  (in_RDI->fParams).contentSizeFlag = 1;
  return in_RDI;
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    memset(&cctxParams, 0, sizeof(cctxParams));
    cctxParams.cParams = cParams;
    cctxParams.compressionLevel = ZSTD_CLEVEL_DEFAULT;  /* should not matter, as all cParams are presumed properly defined */
    assert(!ZSTD_checkCParams(cParams));
    cctxParams.fParams.contentSizeFlag = 1;
    return cctxParams;
}